

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O2

_Bool borg_think_home_buy_useful(void)

{
  uint8_t *puVar1;
  int16_t *piVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  ushort uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  char *what;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint8_t uVar14;
  borg_item_conflict *pbVar15;
  bool bVar16;
  borg_item *item;
  ulong uVar17;
  int local_80;
  int32_t local_7c;
  uint local_78;
  int local_64;
  int local_4c;
  
  local_7c = borg.power;
  local_64 = -1;
  uVar17 = 0;
  local_78 = 0;
  local_4c = 0;
  local_80 = 0;
  bVar5 = false;
  do {
    if (z_info->store_inven_max <= uVar17) {
      if (bVar5) {
        borg_notice(true);
      }
      if (borg.power < local_7c && -1 < local_64) {
        borg.goal.shop = 7;
        borg.goal.ware = (int16_t)local_64;
      }
      return borg.power < local_7c && -1 < local_64;
    }
    if (borg_shops[7].ware[uVar17].iqty != '\0') {
      item = (borg_item *)(borg_shops[7].ware + uVar17);
      bVar16 = false;
      wVar7 = sold_item_num;
      for (lVar13 = 0; lVar13 < wVar7; lVar13 = lVar13 + 1) {
        if (((sold_item_tval[lVar13] == (uint)item->tval) &&
            (sold_item_sval[lVar13] == (uint)item->sval)) && (bVar16 = true, *borg_cfg != 0)) {
          what = format("# Choosing not to buy back \'%s\' from home.",item);
          borg_note(what);
          wVar7 = sold_item_num;
        }
      }
      if ((!bVar16) && (wVar7 = borg_first_empty_inventory_slot(), wVar7 != L'\xffffffff')) {
        if ((item->tval & 0xfe) == 0x16) {
          local_78 = (int)item->pval / (int)(short)(ushort)item->iqty & 0xffff;
        }
        wVar8 = borg_min_item_quantity((borg_item_conflict *)item);
        pbVar15 = borg_shops[7].ware;
        puVar1 = &pbVar15[uVar17].iqty;
        uVar14 = (uint8_t)wVar8;
        *puVar1 = *puVar1 - uVar14;
        sVar3 = (short)wVar8;
        sVar4 = (short)local_78;
        if ((item->tval & 0xfe) == 0x16) {
          piVar2 = &pbVar15[uVar17].pval;
          *piVar2 = *piVar2 - sVar3 * sVar4;
        }
        wVar8 = borg_wield_slot(item);
        uVar11 = (ulong)(uint)wVar8;
        wVar9 = borg_slot((uint)item->tval,(uint)item->sval);
        if (wVar8 < L'\0') {
          if (local_7c < 0) {
            iVar10 = 0;
          }
          else {
LAB_0022d562:
            wVar8 = wVar9;
            if ((wVar9 == L'\xffffffff') &&
               (wVar8 = wVar7, (int)((uint)z_info->pack_size - borg.trait[0x9e]) <= wVar7 + L'\x01')
               ) goto LAB_0022d6ca;
            wVar7 = wVar8;
            memcpy(borg_items + wVar7,borg_safe_shops[7].ware + uVar17,0x388);
            pbVar15 = borg_items;
            if (wVar9 == L'\xffffffff') {
              borg_items[wVar7].iqty = uVar14;
              if ((item->tval & 0xfe) == 0x16) {
                pbVar15[wVar7].pval = sVar3 * sVar4;
              }
            }
            else {
              borg_items[wVar7].iqty = safe_items[wVar7].iqty + uVar14;
              if ((item->tval & 0xfe) == 0x16) {
                piVar2 = &pbVar15[wVar7].pval;
                *piVar2 = *piVar2 + sVar3 * sVar4;
              }
            }
            borg_notice(true);
            bVar5 = true;
            iVar10 = borg_power();
          }
        }
        else {
          uVar6 = z_info->pack_size;
          if ((int)((uint)uVar6 - borg.trait[0x9e]) <= wVar7 + L'\x01') goto LAB_0022d6ca;
          uVar12 = (ulong)wVar7;
          if (wVar8 == (uint)uVar6 + L'\x03') {
            if (borg_items[uVar11].one_ring == false) {
              memcpy(borg_items + uVar12,safe_items + uVar11,0x388);
              memcpy(borg_items + uVar11,borg_safe_shops[7].ware + uVar17,0x388);
              borg_items[uVar11].iqty = '\x01';
              borg_notice(true);
              local_4c = borg_power();
              memcpy(borg_items + uVar11,safe_items + uVar11,0x388);
              uVar6 = z_info->pack_size;
              bVar5 = true;
            }
            if (borg_items[(ulong)uVar6 + 2].one_ring == false) {
              memcpy(borg_items + uVar12,safe_items + (ulong)uVar6 + 2,0x388);
              memcpy(borg_items + (ulong)z_info->pack_size + 2,borg_safe_shops[7].ware + uVar17,
                     0x388);
              borg_items[(ulong)z_info->pack_size + 2].iqty = uVar14;
              borg_notice(true);
              local_80 = borg_power();
              memcpy(borg_items + (ulong)z_info->pack_size + 2,
                     safe_items + (ulong)z_info->pack_size + 2,0x388);
              bVar5 = true;
            }
            iVar10 = local_4c;
            if (local_4c < local_80) {
              iVar10 = local_80;
            }
            pbVar15 = borg_items + uVar12;
            uVar11 = uVar12;
          }
          else {
            memcpy(borg_items + uVar12,safe_items + uVar11,0x388);
            memcpy(borg_items + uVar11,borg_safe_shops[7].ware + uVar17,0x388);
            borg_items[uVar11].iqty = uVar14;
            borg_notice(true);
            iVar10 = borg_power();
            pbVar15 = borg_items + uVar11;
            bVar5 = true;
          }
          memcpy(pbVar15,safe_items + uVar11,0x388);
          if (iVar10 <= local_7c) {
            borg_items[uVar12].iqty = '\0';
            goto LAB_0022d562;
          }
        }
        memcpy(borg_items + wVar7,safe_items + wVar7,0x388);
        memcpy(borg_shops[7].ware + uVar17,borg_safe_shops[7].ware + uVar17,0x388);
        if (local_7c < iVar10) {
          local_64 = (int)uVar17;
          local_7c = iVar10;
        }
      }
    }
LAB_0022d6ca:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

bool borg_think_home_buy_useful(void)
{

    int     hole;
    int     slot, i;
    int     stack;
    int     qty = 1;
    int     n, b_n = -1;
    int     charge_each = 0;
    int32_t p, b_p = 0L;
    int32_t p_left  = 0;
    int32_t p_right = 0;

    bool fix        = false;
    bool skip_it    = false;

    /* Extract the "power" */
    b_p = borg.power;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip it if I just sold it */
        skip_it = false;
        for (i = 0; i < sold_item_num; i++) {
            if (sold_item_tval[i] == item->tval
                && sold_item_sval[i] == item->sval) {
                if (borg_cfg[BORG_VERBOSE])
                    borg_note(
                        format("# Choosing not to buy back '%s' from home.",
                            item->desc));
                skip_it = true;
            }
        }
        if (skip_it == true)
            continue;

        /* Reset the 'hole' in case it was changed by the last stacked item.*/
        hole = borg_first_empty_inventory_slot();
        if (hole == -1)
            continue;

        /* borg_note(format("# Considering buying (%d)'%s' (pval=%d) from
         * home.", item->iqty,item->desc, item->pval)); */

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop (sometimes) */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= (qty * charge_each);

        /* Obtain "slot" */
        slot  = borg_wield_slot(item);
        stack = borg_slot(item->tval, item->sval);

        /* Consider new equipment-- Must check both ring slots */
        p = 0;
        if (slot >= 0) {
            /* Require two empty slots */
            if (hole == -1)
                continue;
            if ((hole + 1) >= PACK_SLOTS)
                continue;

            /* Check Rings */
            if (slot == INVEN_LEFT) {
                /** First Check Left Hand **/

                /* special curse check for left ring */
                if (!borg_items[INVEN_LEFT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[slot],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[slot],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[slot].iqty = 1;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_left = borg_power();
#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p_left));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[slot], &safe_items[slot],
                        sizeof(borg_item));
                }

                /** Second Check Right Hand **/
                /* special curse check for right ring */
                if (!borg_items[INVEN_RIGHT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[INVEN_RIGHT],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[INVEN_RIGHT].iqty = qty;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_right = borg_power();

#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[INVEN_RIGHT].desc, p_right));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[INVEN_RIGHT].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[INVEN_RIGHT], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));
                }

                /* Is this ring better than one of mine? */
                p = MAX(p_right, p_left);

                /* Restore hole */
                memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));
            }

            else /* non rings */
            {
                /* Move equipment into inventory */
                memcpy(&borg_items[hole], &safe_items[slot], sizeof(borg_item));

                /* Move new item into equipment */
                memcpy(&borg_items[slot], &borg_safe_shops[BORG_HOME].ware[n],
                    sizeof(borg_item));

                /* Only a single item */
                borg_items[slot].iqty = qty;

                /* Fix later */
                fix = true;

                /* Examine the inventory */
                borg_notice(true);

                /* Evaluate the inventory */
                p = borg_power();
#if 0
                /* dump list and power...  for debugging */
                borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p));
                borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                /* Restore old item */
                memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));
            } /* non rings */
        } /* equip */

        /* Consider new inventory.*/
        /* note, we may grab an equip able if, for example, we want to ID it */
        if (p <= b_p) {
            /* Restore hole if we are trying an item in inventory that didn't
             * work equipped */
            if (slot >= 0)
                borg_items[hole].iqty = 0;

            if (stack != -1)
                hole = stack;

            /* Require two empty slots */
            if (stack == -1 && hole == -1)
                continue;
            if (stack == -1 && (hole + 1) >= PACK_SLOTS)
                continue;

            /* Move new item into inventory */
            memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
                sizeof(borg_item));

            /* Is this new item merging into an existing stack? */
            if (stack != -1) {
                /* Add a quantity to the stack */
                borg_items[hole].iqty = safe_items[hole].iqty + qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval += (qty * charge_each);

            } else {
                /* Only a single item */
                borg_items[hole].iqty = qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval = (qty * charge_each);
            }

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the equipment */
            p = borg_power();
        }

        /* Restore hole */
        memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and cost */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > borg.power)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}